

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xzlib.c
# Opt level: O2

xzFile xz_open(char *path,int fd,char *mode)

{
  xmlMallocFunc p_Var1;
  xz_statep state;
  size_t sVar2;
  char *__dest;
  uint64_t uVar3;
  
  state = (xz_statep)(*xmlMalloc)(0x1b0);
  if (state != (xz_statep)0x0) {
    state->size = 0;
    state->want = 0x2000;
    state->msg = (char *)0x0;
    state->init = 0;
    p_Var1 = xmlMalloc;
    sVar2 = strlen(path);
    __dest = (char *)(*p_Var1)(sVar2 + 1);
    state->path = __dest;
    if (__dest != (char *)0x0) {
      strcpy(__dest,path);
      if (fd == -1) {
        fd = open64(path,0,0x1b6);
        state->fd = fd;
        if (fd == -1) {
          (*xmlFree)(state->path);
          (*xmlFree)(state);
          return (xzFile)0x0;
        }
      }
      else {
        state->fd = fd;
      }
      uVar3 = lseek64(fd,0,1);
      if (uVar3 == 0xffffffffffffffff) {
        uVar3 = 0;
      }
      state->start = uVar3;
      state->have = 0;
      state->eof = 0;
      state->how = 0;
      state->direct = 1;
      state->seek = 0;
      xz_error(state,0,(char *)0x0);
      state->pos = 0;
      (state->strm).avail_in = 0;
      (state->zstrm).avail_in = 0;
      return state;
    }
    (*xmlFree)(state);
  }
  return (xzFile)0x0;
}

Assistant:

static xzFile
xz_open(const char *path, int fd, const char *mode ATTRIBUTE_UNUSED)
{
    xz_statep state;

    /* allocate xzFile structure to return */
    state = xmlMalloc(sizeof(xz_state));
    if (state == NULL)
        return NULL;
    state->size = 0;            /* no buffers allocated yet */
    state->want = BUFSIZ;       /* requested buffer size */
    state->msg = NULL;          /* no error message yet */
    state->init = 0;            /* initialization of zlib data */

    /* save the path name for error messages */
    state->path = xmlMalloc(strlen(path) + 1);
    if (state->path == NULL) {
        xmlFree(state);
        return NULL;
    }
    strcpy(state->path, path);

    /* open the file with the appropriate mode (or just use fd) */
    state->fd = fd != -1 ? fd : open(path,
#ifdef O_LARGEFILE
                                     O_LARGEFILE |
#endif
#ifdef O_BINARY
                                     O_BINARY |
#endif
                                     O_RDONLY, 0666);
    if (state->fd == -1) {
        xmlFree(state->path);
        xmlFree(state);
        return NULL;
    }

    /* save the current position for rewinding (only if reading) */
    state->start = lseek(state->fd, 0, SEEK_CUR);
    if (state->start == (uint64_t) - 1)
        state->start = 0;

    /* initialize stream */
    xz_reset(state);

    /* return stream */
    return (xzFile) state;
}